

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hu_scores.cpp
# Opt level: O3

void HU_GetPlayerWidths(int *maxnamewidth,int *maxscorewidth,int *maxiconheight)

{
  double dVar1;
  uint uVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined8 *puVar5;
  FTexture *pFVar6;
  int i;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  iVar4 = FFont::StringWidth(SmallFont,"Name");
  *maxnamewidth = iVar4;
  lVar7 = 0;
  *maxscorewidth = 0;
  *maxiconheight = 0;
  do {
    if (playeringame[lVar7] == true) {
      puVar3 = (undefined8 *)
               ((ulong)(((&DAT_00a602d8)[lVar7 * 0xa8] - 1 & 0x1cf) * 0x18) +
               (&DAT_00a602c8)[lVar7 * 0x54]);
      do {
        puVar5 = puVar3;
        puVar3 = (undefined8 *)*puVar5;
      } while (*(int *)(puVar5 + 1) != 0x1cf);
      iVar4 = FFont::StringWidth(SmallFont,*(BYTE **)(puVar5[2] + 0x28));
      if (*maxnamewidth < iVar4) {
        *maxnamewidth = iVar4;
      }
      uVar2 = *(uint *)((&players)[lVar7 * 0x54] + 0x508);
      if (0 < (long)(int)uVar2) {
        if (uVar2 < TexMan.Textures.Count) {
          pFVar6 = TexMan.Textures.Array[(int)uVar2].Texture;
        }
        else {
          pFVar6 = (FTexture *)0x0;
        }
        auVar9._0_8_ = (double)((uint)pFVar6->Width * 2);
        auVar9._8_8_ = (double)(pFVar6->LeftOffset * 2);
        dVar1 = (pFVar6->Scale).X;
        auVar11._8_8_ = dVar1;
        auVar11._0_8_ = dVar1;
        auVar9 = divpd(auVar9,auVar11);
        iVar4 = (((int)auVar9._0_8_ & 1U | 2) + ((int)auVar9._0_8_ >> 1)) -
                (((int)auVar9._8_8_ & 1U) + ((int)auVar9._8_8_ >> 1));
        if (*maxscorewidth < iVar4) {
          *maxscorewidth = iVar4;
        }
        auVar10._0_8_ = (double)((uint)pFVar6->Height * 2);
        auVar10._8_8_ = (double)(pFVar6->TopOffset * 2);
        dVar1 = (pFVar6->Scale).Y;
        auVar12._8_8_ = dVar1;
        auVar12._0_8_ = dVar1;
        auVar9 = divpd(auVar10,auVar12);
        uVar8 = CONCAT44((int)auVar9._8_8_,(int)auVar9._0_8_) & 0x100000001;
        iVar4 = ((int)uVar8 + ((int)auVar9._0_8_ >> 1)) -
                ((int)(uVar8 >> 0x20) + ((int)auVar9._8_8_ >> 1));
        if (*maxiconheight < iVar4) {
          *maxiconheight = iVar4;
        }
      }
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  return;
}

Assistant:

void HU_GetPlayerWidths(int &maxnamewidth, int &maxscorewidth, int &maxiconheight)
{
	maxnamewidth = SmallFont->StringWidth("Name");
	maxscorewidth = 0;
	maxiconheight = 0;

	for (int i = 0; i < MAXPLAYERS; i++)
	{
		if (playeringame[i])
		{
			int width = SmallFont->StringWidth(players[i].userinfo.GetName());
			if (width > maxnamewidth)
			{
				maxnamewidth = width;
			}
			if (players[i].mo->ScoreIcon.isValid())
			{
				FTexture *pic = TexMan[players[i].mo->ScoreIcon];
				width = pic->GetScaledWidth() - pic->GetScaledLeftOffset() + 2;
				if (width > maxscorewidth)
				{
					maxscorewidth = width;
				}
				// The icon's top offset does not count toward its height, because
				// zdoom.pk3's standard Hexen class icons are designed that way.
				int height = pic->GetScaledHeight() - pic->GetScaledTopOffset();
				if (height > maxiconheight)
				{
					maxiconheight = height;
				}
			}
		}
	}
}